

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

JoypadStateIter joypad_get_next_state(JoypadStateIter iter)

{
  JoypadStateIter JVar1;
  JoypadState *local_38;
  size_t index;
  JoypadStateIter iter_local;
  JoypadState *local_10;
  
  iter_local.state = (JoypadState *)iter.chunk;
  if (((long)iter.state - (long)((JoypadChunk *)iter_local.state)->data >> 4) + 1U <
      ((JoypadChunk *)iter_local.state)->size) {
    local_10 = iter.state + 1;
  }
  else {
    iter_local.state = (JoypadState *)((JoypadChunk *)iter_local.state)->next;
    if (((JoypadChunk *)iter_local.state)->size == 0) {
      local_38 = (JoypadState *)0x0;
    }
    else {
      local_38 = ((JoypadChunk *)iter_local.state)->data;
    }
    local_10 = local_38;
  }
  JVar1.state = local_10;
  JVar1.chunk = (JoypadChunk *)iter_local.state;
  return JVar1;
}

Assistant:

JoypadStateIter joypad_get_next_state(JoypadStateIter iter) {
  size_t index = iter.state - iter.chunk->data;
  if (index + 1 < iter.chunk->size) {
    ++iter.state;
    return iter;
  }

  iter.chunk = iter.chunk->next;
  iter.state = iter.chunk->size != 0 ? iter.chunk->data : NULL;
  return iter;
}